

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_ahead_log.cpp
# Opt level: O3

void __thiscall
duckdb::WriteAheadLog::WriteCreateSequence(WriteAheadLog *this,SequenceCatalogEntry *entry)

{
  BinarySerializer *this_00;
  WriteAheadLogSerializer serializer;
  WriteAheadLogSerializer local_5c0;
  
  WriteAheadLogSerializer::WriteAheadLogSerializer(&local_5c0,this,CREATE_SEQUENCE);
  this_00 = &local_5c0.serializer;
  (*local_5c0.serializer.super_Serializer._vptr_Serializer[2])(this_00,0x65,"sequence");
  Serializer::WriteValue<duckdb::SequenceCatalogEntry>(&this_00->super_Serializer,entry);
  (*local_5c0.serializer.super_Serializer._vptr_Serializer[3])(this_00);
  BinarySerializer::OnObjectEnd(this_00);
  ChecksumWriter::Flush(&local_5c0.checksum_writer);
  WriteAheadLogSerializer::~WriteAheadLogSerializer(&local_5c0);
  return;
}

Assistant:

void WriteAheadLog::WriteCreateSequence(const SequenceCatalogEntry &entry) {
	WriteAheadLogSerializer serializer(*this, WALType::CREATE_SEQUENCE);
	serializer.WriteProperty(101, "sequence", &entry);
	serializer.End();
}